

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O1

void __thiscall BarrierTest_PastToken_Test::TestBody(BarrierTest_PastToken_Test *this)

{
  pointer ptVar1;
  ulong uVar2;
  allocator_type *paVar3;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_00;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_01;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_02;
  anon_class_32_3_c61425db_for__M_head_impl *extraout_RDX_03;
  anon_class_32_3_c61425db_for__M_head_impl *__args;
  thread *t;
  ulong __n;
  allocator_type *paVar4;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  long lVar5;
  ulong uVar6;
  allocator_type *paVar7;
  bool bVar8;
  vector<std::thread,_std::allocator<std::thread>_> thds;
  atomic<int> step;
  barrier gate;
  barrier<yamc::detail::default_barrier_completion> barrier;
  vector<std::thread,_std::allocator<std::thread>_> local_158;
  allocator_type *local_140;
  undefined4 local_134;
  thread local_130;
  undefined8 *local_128;
  long local_120;
  barrier *local_118;
  barrier local_110;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  condition_variable local_88 [48];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_134 = 0;
  local_a0 = 2;
  local_98 = 2;
  local_90 = 0;
  std::condition_variable::condition_variable(local_88);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_110.nthread_ = 3;
  local_110.count_ = 3;
  local_110.step_ = 0;
  std::condition_variable::condition_variable(&local_110.cv_);
  local_110.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_110.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_110.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_110.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_110.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __args = extraout_RDX;
  lVar5 = 0;
  do {
    ptVar1 = local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_130._M_id._M_thread = (id)&local_134;
    local_128 = &local_a0;
    local_118 = &local_110;
    local_120 = lVar5;
    if (local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_140 = (allocator_type *)
                  local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if ((long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar6 = (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar2 = uVar6 + (uVar6 == 0);
      __n = uVar2 + uVar6;
      if (0xffffffffffffffe < __n) {
        __n = 0xfffffffffffffff;
      }
      if (CARRY8(uVar2,uVar6)) {
        __n = 0xfffffffffffffff;
      }
      if (__n == 0) {
        paVar4 = (allocator_type *)0x0;
      }
      else {
        paVar4 = (allocator_type *)
                 __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&local_158,__n,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,yamc::test::task_runner<BarrierTest_PastToken_Test::TestBody()::__0>(unsigned_long,BarrierTest_PastToken_Test::TestBody()::__0)::_lambda()_1_>
                (paVar4 + uVar6 * 8,&local_130,__args);
      paVar7 = paVar4;
      for (paVar3 = local_140; paVar3 != (allocator_type *)ptVar1; paVar3 = paVar3 + 8) {
        *(id *)paVar7 = (id)0x0;
        *(native_handle_type *)paVar7 = (native_handle_type)*(id *)paVar3;
        *(id *)paVar3 = (id)0x0;
        paVar7 = paVar7 + 8;
      }
      __args = extraout_RDX_02;
      if (local_140 != (allocator_type *)0x0) {
        operator_delete(local_140);
        __args = extraout_RDX_03;
      }
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(paVar4 + __n * 8);
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)paVar4;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,yamc::test::task_runner<BarrierTest_PastToken_Test::TestBody()::__0>(unsigned_long,BarrierTest_PastToken_Test::TestBody()::__0)::_lambda()_1_>
                ((allocator_type *)
                 local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_130,__args);
      __args = extraout_RDX_00;
      paVar7 = (allocator_type *)
               local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(paVar7 + 8);
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  yamc::test::barrier::await(&local_110);
  ptVar1 = local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar4 = (allocator_type *)
                local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; paVar4 != (allocator_type *)ptVar1;
      paVar4 = paVar4 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_158);
  std::condition_variable::~condition_variable(&local_110.cv_);
  std::condition_variable::~condition_variable(local_88);
  return;
}

Assistant:

TEST(BarrierTest, PastToken)
{
  SETUP_STEPTEST;
  yamc::barrier<> barrier{2};
  yamc::test::task_runner(
    2,
    [&](std::size_t id) {
      switch (id) {
      case 0:
      {
        EXPECT_STEP(1);
        auto token = barrier.arrive();
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.wait(std::move(token)));  // past token
        EXPECT_STEP(3);
        break;
      }
      case 1:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(2);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        break;
      }
    }
  );
}